

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int jsonParse(JsonParse *pParse,sqlite3_context *pCtx,char *zJson)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  byte *pbVar4;
  
  pParse->oom = '\0';
  pParse->nErr = '\0';
  pParse->iDepth = 0;
  pParse->nJson = 0;
  *(undefined8 *)&pParse->iHold = 0;
  pParse->zJson = (char *)0x0;
  pParse->aUp = (u32 *)0x0;
  pParse->nNode = 0;
  pParse->nAlloc = 0;
  pParse->aNode = (JsonNode *)0x0;
  if (zJson != (char *)0x0) {
    pParse->zJson = zJson;
    uVar2 = jsonParseValue(pParse,0);
    if (0 < (int)uVar2 && pParse->oom == '\0') {
      iVar3 = uVar2 - 1;
      pbVar4 = (byte *)(zJson + uVar2);
      do {
        bVar1 = *pbVar4;
        iVar3 = iVar3 + 1;
        pbVar4 = pbVar4 + 1;
      } while (""[bVar1] != '\0');
      if (0 < iVar3 && bVar1 == 0) {
        return 0;
      }
    }
    if (pCtx != (sqlite3_context *)0x0) {
      if (pParse->oom == '\0') {
        sqlite3_result_error(pCtx,"malformed JSON",-1);
      }
      else {
        sqlite3_result_error_nomem(pCtx);
      }
    }
    jsonParseReset(pParse);
  }
  return 1;
}

Assistant:

static int jsonParse(
  JsonParse *pParse,           /* Initialize and fill this JsonParse object */
  sqlite3_context *pCtx,       /* Report errors here */
  const char *zJson            /* Input JSON text to be parsed */
){
  int i;
  memset(pParse, 0, sizeof(*pParse));
  if( zJson==0 ) return 1;
  pParse->zJson = zJson;
  i = jsonParseValue(pParse, 0);
  if( pParse->oom ) i = -1;
  if( i>0 ){
    assert( pParse->iDepth==0 );
    while( safe_isspace(zJson[i]) ) i++;
    if( zJson[i] ) i = -1;
  }
  if( i<=0 ){
    if( pCtx!=0 ){
      if( pParse->oom ){
        sqlite3_result_error_nomem(pCtx);
      }else{
        sqlite3_result_error(pCtx, "malformed JSON", -1);
      }
    }
    jsonParseReset(pParse);
    return 1;
  }
  return 0;
}